

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

size_t ZSTD_decompressContinueStream
                 (ZSTD_DStream *zds,char **op,char *oend,void *src,size_t srcSize)

{
  ZSTD_dStage ZVar1;
  size_t err_code;
  size_t sVar2;
  ZSTD_dStreamStage ZVar3;
  
  ZVar1 = zds->stage;
  if (zds->outBufferMode == ZSTD_bm_buffered) {
    if (ZVar1 == ZSTDds_skipFrame) {
      sVar2 = 0;
    }
    else {
      sVar2 = zds->outBuffSize - zds->outStart;
    }
    sVar2 = ZSTD_decompressContinue(zds,zds->outBuff + zds->outStart,sVar2,src,srcSize);
    if (0xffffffffffffff88 < sVar2) {
      return sVar2;
    }
    if ((ZVar1 == ZSTDds_skipFrame) || (ZVar3 = zdss_read, sVar2 != 0)) {
      zds->outEnd = zds->outStart + sVar2;
      ZVar3 = zdss_flush;
    }
  }
  else {
    if (ZVar1 == ZSTDds_skipFrame) {
      sVar2 = 0;
    }
    else {
      sVar2 = (long)oend - (long)*op;
    }
    sVar2 = ZSTD_decompressContinue(zds,*op,sVar2,src,srcSize);
    if (0xffffffffffffff88 < sVar2) {
      return sVar2;
    }
    *op = *op + sVar2;
    ZVar3 = zdss_read;
  }
  zds->streamStage = ZVar3;
  return 0;
}

Assistant:

static size_t ZSTD_decompressContinueStream(
            ZSTD_DStream* zds, char** op, char* oend,
            void const* src, size_t srcSize) {
    int const isSkipFrame = ZSTD_isSkipFrame(zds);
    if (zds->outBufferMode == ZSTD_bm_buffered) {
        size_t const dstSize = isSkipFrame ? 0 : zds->outBuffSize - zds->outStart;
        size_t const decodedSize = ZSTD_decompressContinue(zds,
                zds->outBuff + zds->outStart, dstSize, src, srcSize);
        FORWARD_IF_ERROR(decodedSize, "");
        if (!decodedSize && !isSkipFrame) {
            zds->streamStage = zdss_read;
        } else {
            zds->outEnd = zds->outStart + decodedSize;
            zds->streamStage = zdss_flush;
        }
    } else {
        /* Write directly into the output buffer */
        size_t const dstSize = isSkipFrame ? 0 : (size_t)(oend - *op);
        size_t const decodedSize = ZSTD_decompressContinue(zds, *op, dstSize, src, srcSize);
        FORWARD_IF_ERROR(decodedSize, "");
        *op += decodedSize;
        /* Flushing is not needed. */
        zds->streamStage = zdss_read;
        assert(*op <= oend);
        assert(zds->outBufferMode == ZSTD_bm_stable);
    }
    return 0;
}